

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

UBool charIterTextAccess(UText *ut,int64_t index,UBool forward)

{
  long *plVar1;
  bool bVar2;
  UChar UVar3;
  int iVar4;
  long lVar5;
  UChar *pUVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  uVar7 = (uint)index;
  if ((int)uVar7 < 0) {
    if (forward == '\0') {
      uVar8 = 0;
      bVar2 = true;
      uVar7 = 0;
      goto LAB_0030915f;
    }
    lVar5 = ut->a;
    uVar8 = 0;
    bVar11 = false;
  }
  else {
    lVar5 = ut->a;
    uVar8 = (uint)lVar5;
    if ((long)(ulong)(uVar7 & 0x7fffffff) < lVar5) {
      uVar8 = uVar7;
    }
    bVar11 = 0 < (int)uVar8;
    if (0 < (int)uVar8 && forward == '\0') {
      bVar2 = true;
      uVar7 = uVar8 - 1;
      goto LAB_0030915f;
    }
    if (forward == '\0') {
      bVar2 = true;
      uVar7 = uVar8;
      goto LAB_0030915f;
    }
  }
  bVar2 = false;
  uVar7 = uVar8 - (byte)(lVar5 == (int)uVar8 & bVar11);
LAB_0030915f:
  uVar10 = uVar7 + 0xf;
  if (-1 < (int)uVar7) {
    uVar10 = uVar7;
  }
  uVar10 = uVar10 & 0xfffffff0;
  lVar9 = (long)(int)uVar10;
  lVar5 = ut->chunkNativeStart;
  if (ut->chunkNativeStart != lVar9) {
    lVar5 = 0x50;
    if ((ut->b == uVar10) || (lVar5 = 0x58, ut->c == uVar10)) {
      pUVar6 = *(UChar **)((long)&ut->magic + lVar5);
    }
    else {
      plVar1 = (long *)ut->context;
      pUVar6 = (UChar *)ut->p;
      if (pUVar6 == ut->chunkContents) {
        pUVar6 = (UChar *)ut->q;
      }
      (**(code **)(*plVar1 + 0x78))(plVar1,uVar10);
      lVar5 = 0;
      do {
        UVar3 = (**(code **)(*plVar1 + 0x28))(plVar1);
        pUVar6[lVar5] = UVar3;
        if (ut->a < lVar5 + lVar9) break;
        bVar11 = lVar5 != 0xf;
        lVar5 = lVar5 + 1;
      } while (bVar11);
    }
    ut->chunkContents = pUVar6;
    ut->chunkLength = 0x10;
    ut->chunkNativeStart = lVar9;
    ut->chunkNativeLimit = (long)(int)(uVar10 + 0x10);
    lVar5 = ut->a;
    iVar4 = 0x10;
    if (lVar5 < (int)(uVar10 + 0x10)) {
      ut->chunkNativeLimit = lVar5;
      iVar4 = (int)lVar5 - uVar10;
      ut->chunkLength = iVar4;
    }
    ut->nativeIndexingLimit = iVar4;
    lVar5 = lVar9;
  }
  iVar4 = uVar8 - (int)lVar5;
  ut->chunkOffset = iVar4;
  if (bVar2) {
    bVar2 = 0 < iVar4;
  }
  else {
    bVar2 = iVar4 < ut->chunkLength;
  }
  return bVar2;
}

Assistant:

static UBool U_CALLCONV
charIterTextAccess(UText *ut, int64_t index, UBool  forward) {
    CharacterIterator *ci   = (CharacterIterator *)ut->context;

    int32_t clippedIndex = (int32_t)index;
    if (clippedIndex<0) {
        clippedIndex=0;
    } else if (clippedIndex>=ut->a) {
        clippedIndex=(int32_t)ut->a;
    }
    int32_t neededIndex = clippedIndex;
    if (!forward && neededIndex>0) {
        // reverse iteration, want the position just before what was asked for.
        neededIndex--;
    } else if (forward && neededIndex==ut->a && neededIndex>0) {
        // Forward iteration, don't ask for something past the end of the text.
        neededIndex--;
    }

    // Find the native index of the start of the buffer containing what we want.
    neededIndex -= neededIndex % CIBufSize;

    UChar *buf = NULL;
    UBool  needChunkSetup = TRUE;
    int    i;
    if (ut->chunkNativeStart == neededIndex) {
        // The buffer we want is already the current chunk.
        needChunkSetup = FALSE;
    } else if (ut->b == neededIndex) {
        // The first buffer (buffer p) has what we need.
        buf = (UChar *)ut->p;
    } else if (ut->c == neededIndex) {
        // The second buffer (buffer q) has what we need.
        buf = (UChar *)ut->q;
    } else {
        // Neither buffer already has what we need.
        // Load new data from the character iterator.
        // Use the buf that is not the current buffer.
        buf = (UChar *)ut->p;
        if (ut->p == ut->chunkContents) {
            buf = (UChar *)ut->q;
        }
        ci->setIndex(neededIndex);
        for (i=0; i<CIBufSize; i++) {
            buf[i] = ci->nextPostInc();
            if (i+neededIndex > ut->a) {
                break;
            }
        }
    }

    // We have a buffer with the data we need.
    // Set it up as the current chunk, if it wasn't already.
    if (needChunkSetup) {
        ut->chunkContents = buf;
        ut->chunkLength   = CIBufSize;
        ut->chunkNativeStart = neededIndex;
        ut->chunkNativeLimit = neededIndex + CIBufSize;
        if (ut->chunkNativeLimit > ut->a) {
            ut->chunkNativeLimit = ut->a;
            ut->chunkLength  = (int32_t)(ut->chunkNativeLimit)-(int32_t)(ut->chunkNativeStart);
        }
        ut->nativeIndexingLimit = ut->chunkLength;
        U_ASSERT(ut->chunkOffset>=0 && ut->chunkOffset<=CIBufSize);
    }
    ut->chunkOffset = clippedIndex - (int32_t)ut->chunkNativeStart;
    UBool success = (forward? ut->chunkOffset<ut->chunkLength : ut->chunkOffset>0);
    return success;
}